

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

void __thiscall
cs::compiler_type::process_token_buff
          (compiler_type *this,deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *tokens,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *ast)

{
  _Elt_pointer pptVar1;
  int iVar2;
  _Map_pointer ppptVar3;
  size_type sVar4;
  token_base **it;
  value_type *__x;
  _Map_pointer ppptVar5;
  _Deque_impl_data *__b;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *this_00;
  token_base **ptr;
  _Deque_impl_data *__x_00;
  _Elt_pointer pptVar6;
  token_base **ptr_1;
  value_type *pptVar7;
  _Elt_pointer __x_01;
  _Map_pointer local_158;
  _Elt_pointer *local_148;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> expr;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> tmp;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> oldt;
  
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::_Deque_base
            (&oldt.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::_Deque_base
            (&expr.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>);
  __b = (_Deque_impl_data *)&oldt;
  std::swap<std::_Deque_base<cs::token_base*,std::allocator<cs::token_base*>>::_Deque_impl_data>
            ((_Deque_impl_data *)tokens,__b);
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::clear(tokens);
  local_148 = (_Elt_pointer *)
              oldt.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>._M_impl.
              super__Deque_impl_data._M_start._M_last;
  local_158 = oldt.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>._M_impl.
              super__Deque_impl_data._M_start._M_node;
  __x_00 = (_Deque_impl_data *)
           oldt.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  do {
    if (__x_00 == (_Deque_impl_data *)
                  oldt.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_cur) {
      std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::_Deque_base
                (&tmp.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>);
      __x_01 = (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
               _M_impl.super__Deque_impl_data._M_start._M_cur;
      pptVar6 = (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                _M_impl.super__Deque_impl_data._M_start._M_last;
      ppptVar5 = (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                 _M_impl.super__Deque_impl_data._M_start._M_node;
      pptVar1 = (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                _M_impl.super__Deque_impl_data._M_finish._M_cur;
      while (__x_01 != pptVar1) {
        std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::push_back(&tmp,__x_01);
        if (*__x_01 != (value_type)0x0) {
          iVar2 = (*(*__x_01)->_vptr_token_base[2])();
          if (iVar2 == 1) {
            sVar4 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::size(&tmp);
            if (1 < sVar4) {
              std::
              deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
              ::push_back(ast,&tmp);
            }
            std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::clear(&tmp);
          }
        }
        __x_01 = __x_01 + 1;
        if (__x_01 == pptVar6) {
          __x_01 = ppptVar5[1];
          ppptVar5 = ppptVar5 + 1;
          pptVar6 = __x_01 + 0x40;
        }
      }
      sVar4 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::size(&tmp);
      if (1 < sVar4) {
        std::
        deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
        ::push_back(ast,&tmp);
      }
      std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base
                (&tmp.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>);
      std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base
                (&expr.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>);
      std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base
                (&oldt.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>);
      return;
    }
    iVar2 = (*(code *)(*__x_00->_M_map)[2])();
    ppptVar3 = __x_00->_M_map;
    if ((iVar2 == 3) && (*(int *)(ppptVar3 + 2) == 0)) {
      ppptVar3 = (_Map_pointer)token_base::operator_new((token_base *)0x10,(size_t)__b);
      ppptVar3[1] = __x_00->_M_map[1];
      *ppptVar3 = (token_base **)&PTR__token_base_00373e68;
      __x_00->_M_map = ppptVar3;
    }
    iVar2 = (*(code *)(*ppptVar3)[2])();
    if (iVar2 == 2) {
LAB_002ddffe:
      this_00 = tokens;
      if (expr.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>._M_impl.
          super__Deque_impl_data._M_finish._M_cur !=
          expr.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>._M_impl.
          super__Deque_impl_data._M_start._M_cur) {
        translator_type::match_grammar(&this->translator,&this->context,&expr);
        pptVar6 = expr.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_cur;
        __x = expr.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur;
        ppptVar5 = expr.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>.
                   _M_impl.super__Deque_impl_data._M_start._M_node;
        pptVar7 = expr.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_last;
        while (__x != pptVar6) {
          std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::push_back(tokens,__x);
          __x = __x + 1;
          if (__x == pptVar7) {
            __x = ppptVar5[1];
            ppptVar5 = ppptVar5 + 1;
            pptVar7 = __x + 0x40;
          }
        }
        std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::clear(&expr);
      }
    }
    else {
      iVar2 = (*(code *)(*__x_00->_M_map)[2])();
      this_00 = &expr;
      if (iVar2 == 1) goto LAB_002ddffe;
    }
    __b = __x_00;
    std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::push_back
              (this_00,(value_type *)__x_00);
    __x_00 = (_Deque_impl_data *)&__x_00->_M_map_size;
    if (__x_00 == (_Deque_impl_data *)local_148) {
      __x_00 = (_Deque_impl_data *)local_158[1];
      local_158 = local_158 + 1;
      local_148 = &__x_00[6]._M_start._M_last;
    }
  } while( true );
}

Assistant:

void
	compiler_type::process_token_buff(std::deque<token_base *> &tokens, std::deque<std::deque<token_base *>> &ast)
	{
		std::deque<token_base *> oldt, expr;
		std::swap(tokens, oldt);
		tokens.clear();
		for (auto &ptr: oldt) {
			if (ptr->get_type() == token_types::signal &&
			        static_cast<token_signal *>(ptr)->get_signal() == signal_types::endline_)
				ptr = new token_endline(ptr->get_line_num());
			if (ptr->get_type() == token_types::action || ptr->get_type() == token_types::endline) {
				if (!expr.empty()) {
					translator.match_grammar(context, expr);
					for (auto &it: expr)
						tokens.push_back(it);
					expr.clear();
				}
				tokens.push_back(ptr);
			}
			else
				expr.push_back(ptr);
		}
		std::deque<token_base *> tmp;
		for (auto &ptr: tokens) {
			tmp.push_back(ptr);
			if (ptr != nullptr && ptr->get_type() == token_types::endline) {
				if (tmp.size() > 1)
					ast.push_back(tmp);
				tmp.clear();
			}
		}
		if (tmp.size() > 1)
			ast.push_back(tmp);
	}